

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall fmcalc::init_programme(fmcalc *this,int maxRunLevel)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_02;
  FILE *__stream;
  size_t sVar1;
  pointer piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer pvVar7;
  pointer pvVar8;
  fm_programme f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string file;
  
  std::__cxx11::string::string((string *)&file,"input/fm_programme.bin",(allocator *)&f);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &this->inputpath_,&local_70);
    std::__cxx11::string::operator=((string *)&file,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)&local_70);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    if (maxRunLevel != -1) {
      this->maxRunLevel_ = maxRunLevel;
    }
    this_00 = &this->level_to_maxagg_id_;
    if ((this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_70._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize(this_00,1,(value_type_conflict1 *)&local_70);
    }
    sVar1 = fread(&f,0xc,1,__stream);
    this_01 = &this->pfm_vec_vec_;
    this_02 = &this->node_to_direct_sub_nodes_vec_;
    while (sVar1 != 0) {
      if (f.level_id <= this->maxRunLevel_) {
        if (this->maxLevel_ < f.level_id) {
          this->maxLevel_ = f.level_id;
          local_70._M_dataplus._M_p._0_4_ = 0xffffffff;
          std::vector<int,_std::allocator<int>_>::resize
                    (this_00,(long)f.level_id + 1,(value_type_conflict1 *)&local_70);
        }
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (f.level_id == 1) {
          if (*piVar3 < f.from_agg_id) {
            *piVar3 = f.from_agg_id;
          }
          pvVar7 = (this->pfm_vec_vec_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->pfm_vec_vec_).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pvVar7) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(this_01,1);
            pvVar7 = (this_01->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          piVar2 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)f.from_agg_id;
          if ((ulong)((long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2 >> 2) < lVar6 + 1U) {
            std::vector<int,_std::allocator<int>_>::resize(pvVar7,lVar6 + 1U);
            piVar2 = (((this_01->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar6 = (long)f.from_agg_id;
          }
          piVar2[lVar6] = f.from_agg_id;
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        if (piVar3[f.level_id] < f.to_agg_id) {
          piVar3[f.level_id] = f.to_agg_id;
        }
        lVar6 = (long)f.level_id;
        pvVar7 = (this->pfm_vec_vec_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->pfm_vec_vec_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <
            lVar6 + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(this_01,(long)(f.level_id + 1));
          lVar6 = (long)f.level_id;
          pvVar7 = (this_01->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        lVar5 = *(long *)&pvVar7[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        lVar4 = (long)f.from_agg_id;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar7[lVar6].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar5 >> 2) < lVar4 + 1U)
        {
          std::vector<int,_std::allocator<int>_>::resize(pvVar7 + lVar6,(long)(f.from_agg_id + 1));
          lVar4 = (long)f.from_agg_id;
          lVar5 = *(long *)&(this_01->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[f.level_id].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
        }
        *(int *)(lVar5 + lVar4 * 4) = f.to_agg_id;
        if (f.to_agg_id == 0) {
          fwrite("FATAL: Invalid agg id from fm_programme.bin\n",0x2c,1,_stderr);
        }
        pvVar8 = (this->node_to_direct_sub_nodes_vec_).
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)f.level_id;
        if ((ulong)(((long)(this->node_to_direct_sub_nodes_vec_).
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8) / 0x18) <
            lVar6 + 1U) {
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::resize(this_02,(long)(f.level_id + 1));
          std::
          vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
          ::resize(&this->node_to_coverage_ids_,(long)f.level_id + 1);
          lVar6 = (long)f.level_id;
          pvVar8 = (this_02->
                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        lVar5 = *(long *)&pvVar8[lVar6].
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar4 = (long)f.to_agg_id;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar8[lVar6].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - lVar5) / 0x18) <
            lVar4 + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(pvVar8 + lVar6,(long)(f.to_agg_id + 1));
          std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::resize((this->node_to_coverage_ids_).
                   super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + f.level_id,(long)f.to_agg_id + 1);
          lVar4 = (long)f.to_agg_id;
          lVar5 = *(long *)&(this_02->
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[f.level_id].
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)(lVar4 * 0x18 + lVar5),&f.from_agg_id);
      }
      sVar1 = fread(&f,0xc,1,__stream);
    }
    fclose(__stream);
    std::__cxx11::string::~string((string *)&file);
    return;
  }
  fprintf(_stderr,"FATAL: %s: cannot open %s\n","init_programme",file._M_dataplus._M_p);
  exit(1);
}

Assistant:

void fmcalc::init_programme(int maxRunLevel)
{

	FILE *fin = NULL;
	std::string file = FMPROGRAMME_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL){
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fm_programme f;
    if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	if (level_to_maxagg_id_.size() == 0) {
		level_to_maxagg_id_.resize(1, -1);
	}
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
        if (f.level_id <= maxRunLevel_){
			if (maxLevel_ < f.level_id) {
				maxLevel_ = f.level_id;
				level_to_maxagg_id_.resize(maxLevel_ + 1, -1);
			}
			if (f.level_id == 1) {	
				if (f.from_agg_id > level_to_maxagg_id_[0])level_to_maxagg_id_[0] = f.from_agg_id;
				if (pfm_vec_vec_.size() < 1) {
					pfm_vec_vec_.resize(1);
				}
				if (pfm_vec_vec_[0].size() < (size_t)f.from_agg_id + 1) {
					pfm_vec_vec_[0].resize(f.from_agg_id + 1);
				}
				pfm_vec_vec_[0][f.from_agg_id] = f.from_agg_id;
			}					
			if (f.to_agg_id > level_to_maxagg_id_[f.level_id])level_to_maxagg_id_[f.level_id] = f.to_agg_id;
            if (pfm_vec_vec_.size() < (size_t)f.level_id + 1) {
                pfm_vec_vec_.resize(f.level_id + 1);
            }
            if (pfm_vec_vec_[f.level_id].size() < (size_t)f.from_agg_id + 1) {
                pfm_vec_vec_[f.level_id].resize(f.from_agg_id + 1);
            }
            pfm_vec_vec_[f.level_id][f.from_agg_id] = f.to_agg_id;
            if (f.to_agg_id == 0) {
                fprintf(stderr, "FATAL: Invalid agg id from fm_programme.bin\n");
            }

	    // Fill node_to_direct_sub_nodes_vec_[level_id][to_agg_id] = vector<int>(from_agg_id)
	    if (node_to_direct_sub_nodes_vec_.size() < (size_t)f.level_id + 1) {
		node_to_direct_sub_nodes_vec_.resize(f.level_id + 1);
		node_to_coverage_ids_.resize(f.level_id + 1);
	    }
	    if (node_to_direct_sub_nodes_vec_[f.level_id].size() < (size_t)f.to_agg_id + 1) {
		node_to_direct_sub_nodes_vec_[f.level_id].resize(f.to_agg_id + 1);
		node_to_coverage_ids_[f.level_id].resize(f.to_agg_id + 1);
	    }
	    node_to_direct_sub_nodes_vec_[f.level_id][f.to_agg_id].push_back(f.from_agg_id);
        }
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);

}